

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int declaration(void)

{
  int iVar1;
  sym_t *s_00;
  int unaff_retaddr;
  sym_t *s;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  s_00 = create_sym();
  iVar1 = declaration_specifiers
                    ((sym_t *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  if (iVar1 != 0) {
    if (t->id == 0x3b) {
      in_stack_ffffffffffffffec = last_id;
      if ((last_id == 0x80) || (last_id == 0x84 || last_id == 0x85)) {
        err(W,"useless type name in empty declaration");
      }
      else {
        err(W,"empty declaration");
      }
    }
    init_declarator_list((sym_t *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    if (((s_00->type_id == 0x84) && (s_00->function == 0)) && (s_00->id[0] != '\0')) {
      err(E,"variable or field \'%s\' declared void",s_00);
    }
    if (t->id == 0x3b) {
      syms_add(s_00);
      next();
      return 1;
    }
    expect(unaff_retaddr);
    sync();
  }
  free(s_00);
  return 0;
}

Assistant:

int declaration()
{
    sym_t* s = create_sym();

    if (declaration_specifiers(s))
    {
        if (t->id == ';')
        {
            switch(last_id)
            {
                case BYTE:
                case WORD:
                case VOID:
                    err(W, "useless type name in empty declaration");
                    break;

                default:
                    err(W, "empty declaration");
            }
        }

        init_declarator_list(s);

        if (s->type_id == VOID && !s->function && s->id[0])
            err(E, "variable or field '%s' declared void", s->id);

        if (t->id == ';') /* Do not use expect to not fuck up eline */
        {
            syms_add(s);
            next();
            return 1;
        }
        else
            expect(';'); /* Use expect to generate the error message */

        sync(";");
    }

    free(s);
    return 0;
}